

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

_Bool ecs_query_next(ecs_iter_t *it)

{
  int iVar1;
  int iVar2;
  ecs_query_t *peVar3;
  ecs_table_t *peVar4;
  ecs_vector_t *vector;
  ecs_table_t *vector_00;
  uint64_t *puVar5;
  ulong uVar6;
  ecs_switch_t *sw;
  int32_t iVar7;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  ecs_data_t *peVar13;
  void *pvVar14;
  ecs_bs_column_t *peVar15;
  long lVar16;
  ulong *puVar17;
  ecs_data_t *peVar18;
  ecs_sw_column_t *peVar19;
  uint64_t uVar20;
  int *piVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ecs_iter_table_t *peVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined8 *puVar34;
  uint uVar35;
  ulong uVar36;
  bool bVar37;
  ecs_world_t *world;
  ecs_world_t *local_38;
  
  _ecs_assert(it != (ecs_iter_t *)0x0,2,(char *)0x0,"it != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xae8);
  if (it == (ecs_iter_t *)0x0) {
    __assert_fail("it != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xae8,"_Bool ecs_query_next(ecs_iter_t *)");
  }
  local_38 = it->world;
  peVar3 = it->query;
  ecs_get_stage(&local_38);
  pvVar11 = _ecs_vector_first(peVar3->table_slices,0x10,0x10);
  pvVar12 = _ecs_vector_first(peVar3->tables,0x50,0x10);
  if (pvVar11 == (void *)0x0) {
    _ecs_assert(true,0xc,(char *)0x0,"!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
  }
  else {
    _ecs_assert(peVar3->compare != (ecs_compare_action_t)0x0,0xc,(char *)0x0,
                "!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
    if (peVar3->compare == (ecs_compare_action_t)0x0) {
      __assert_fail("!slice || query->compare",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xaf4,"_Bool ecs_query_next(ecs_iter_t *)");
    }
  }
  iVar1 = it->table_count;
  iVar24 = (it->iter).query.index;
  if (iVar24 < iVar1) {
    iVar2 = it->total_count;
    lVar22 = (long)iVar24;
    do {
      if (pvVar11 == (void *)0x0) {
        peVar29 = (ecs_iter_table_t *)(lVar22 * 0x50 + (long)pvVar12);
      }
      else {
        peVar29 = *(ecs_iter_table_t **)((long)pvVar11 + lVar22 * 0x10);
      }
      peVar4 = peVar29->table;
      iVar24 = (int)(lVar22 + 1);
      (it->iter).query.index = iVar24;
      if (peVar4 == (ecs_table_t *)0x0) goto LAB_0011ab2c;
      vector = (ecs_vector_t *)peVar29[1].columns;
      vector_00 = peVar29[1].table;
      peVar13 = ecs_table_get_data(peVar4);
      _ecs_assert(peVar13 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xb06);
      if (peVar13 == (ecs_data_t *)0x0) {
        __assert_fail("data != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xb06,"_Bool ecs_query_next(ecs_iter_t *)");
      }
      it->table_columns = peVar13->columns;
      if (pvVar11 == (void *)0x0) {
        iVar31 = ecs_table_count(peVar4);
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint *)((long)pvVar11 + lVar22 * 0x10 + 8);
        iVar31 = *(int *)((long)pvVar11 + lVar22 * 0x10 + 0xc);
      }
      if (iVar31 != 0) {
        if (vector_00 != (ecs_table_t *)0x0) {
          iVar7 = ecs_vector_count((ecs_vector_t *)vector_00);
          pvVar14 = _ecs_vector_first((ecs_vector_t *)vector_00,0x10,0x10);
          if (iVar7 < 1) {
            uVar35 = 0;
          }
          else {
            iVar10 = peVar4->bs_column_offset;
            uVar25 = (it->iter).query.bitset_first;
            iVar33 = 0;
            uVar35 = 0;
            do {
              peVar15 = *(ecs_bs_column_t **)((long)pvVar14 + (long)iVar33 * 0x10);
              if (peVar15 == (ecs_bs_column_t *)0x0) {
                puVar34 = (undefined8 *)((long)iVar33 * 0x10 + (long)pvVar14);
                peVar18 = peVar4->data;
                iVar27 = *(int *)(puVar34 + 1);
                _ecs_assert(-1 < iVar27 - iVar10,0xc,(char *)0x0,"(index - bs_offset >= 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0xa5a);
                uVar28 = iVar27 - iVar10;
                if ((int)uVar28 < 0) {
                  __assert_fail("(index - bs_offset >= 0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0xa5a,
                                "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                               );
                }
                peVar15 = peVar18->bs_columns + uVar28;
                *puVar34 = peVar15;
              }
              iVar27 = (peVar15->data).count;
              iVar30 = (int)uVar25 >> 6;
              iVar32 = iVar27 + -1 >> 6;
              if (iVar32 < iVar30) goto LAB_0011aacd;
              puVar5 = (peVar15->data).data;
              uVar25 = uVar25 & 0x3f;
              lVar16 = (long)iVar30;
              uVar20 = puVar5[lVar16];
              if ((*(ulong *)(bitset_column_next_bitmask_remain + (ulong)uVar25 * 8) & uVar20) == 0)
              {
                do {
                  if (iVar32 == lVar16) goto LAB_0011aacd;
                  uVar20 = puVar5[lVar16 + 1];
                  lVar16 = lVar16 + 1;
                } while (uVar20 == 0);
                uVar25 = 0;
                iVar30 = (int)lVar16;
              }
              uVar23 = (ulong)uVar25;
              while (((&bitset_column_next_bitmask)[uVar23] & uVar20) == 0) {
                uVar36 = uVar23 + 1;
                _ecs_assert(uVar23 < 0x3f,0xc,(char *)0x0,"bs_start < 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0xa7f);
                uVar23 = uVar36;
                if (uVar36 == 0x40) {
                  __assert_fail("bs_start < 64",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0xa7f,
                                "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                               );
                }
              }
              uVar36 = uVar23 & 0xffffffff;
              iVar26 = iVar30;
              if ((*(ulong *)(bitset_column_next_bitmask_remain + uVar23 * 8) & ~uVar20) == 0) {
                lVar16 = 0;
                do {
                  if ((long)iVar32 - (long)iVar30 == lVar16) {
                    uVar36 = 0;
                    goto LAB_0011a783;
                  }
                  uVar20 = puVar5[(long)iVar30 + lVar16 + 1];
                  lVar16 = lVar16 + 1;
                } while (uVar20 == 0xffffffffffffffff);
                iVar26 = (int)lVar16 + iVar30;
                uVar36 = 0;
              }
              if (iVar26 == iVar32 + 1) {
LAB_0011a783:
                _ecs_assert(true,0xc,(char *)0x0,"bs_end < 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0xa9a);
                iVar26 = iVar32 + 1;
              }
              else {
                puVar17 = &bitset_column_next_bitmask + uVar36;
                uVar36 = uVar36 - 1;
                do {
                  uVar36 = uVar36 + 1;
                  uVar6 = *puVar17;
                  puVar17 = puVar17 + 1;
                } while ((uVar6 & uVar20) != 0);
                _ecs_assert(uVar36 < 0x40,0xc,(char *)0x0,"bs_end < 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0xa9a);
                if (0x3f < uVar36) {
                  __assert_fail("bs_end < 64",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0xa9a,
                                "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                               );
                }
              }
              uVar25 = iVar30 * 0x40 + (int)uVar23;
              uVar28 = iVar26 * 0x40 + (int)uVar36;
              if (uVar25 == uVar28) goto LAB_0011aacd;
              if (iVar33 == 0) {
LAB_0011a7e0:
                uVar35 = uVar28;
                iVar31 = uVar35 - uVar25;
                if (iVar27 <= (int)(uVar35 - uVar25)) {
                  iVar31 = iVar27;
                }
                (it->iter).query.bitset_first = uVar25;
                iVar30 = iVar33 + 1;
                uVar8 = uVar25;
              }
              else {
                iVar30 = 0;
                if ((int)uVar25 < (int)uVar35) {
                  if ((int)uVar35 <= (int)uVar28) {
                    uVar28 = uVar35;
                  }
                  goto LAB_0011a7e0;
                }
              }
              iVar33 = iVar30;
            } while (iVar33 < iVar7);
          }
          (it->iter).query.bitset_first = uVar35;
          (it->iter).query.index = (int32_t)lVar22;
        }
        if (vector != (ecs_vector_t *)0x0) {
          iVar31 = (it->iter).query.sparse_smallest;
          iVar7 = iVar31;
          if (iVar31 == 0) {
            pvVar14 = _ecs_vector_first(vector,0x18,0x10);
            uVar8 = ecs_vector_count(vector);
            if ((int)uVar8 < 1) {
              iVar7 = 0;
            }
            else {
              lVar16 = 0;
              iVar10 = 0x7fffffff;
              iVar33 = 1;
              iVar7 = 0;
              do {
                peVar19 = *(ecs_sw_column_t **)((long)pvVar14 + lVar16);
                if (peVar19 == (ecs_sw_column_t *)0x0) {
                  iVar27 = peVar29->columns[*(int *)((long)pvVar14 + lVar16 + 0x10)];
                  iVar30 = peVar4->sw_column_offset;
                  _ecs_assert(0 < iVar27 - iVar30,0xc,(char *)0x0,"table_column_index >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x9b9);
                  if (iVar27 - iVar30 == 0 || iVar27 < iVar30) {
                    __assert_fail("table_column_index >= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x9b9,
                                  "int find_smallest_column(ecs_table_t *, ecs_matched_table_t *, ecs_vector_t *)"
                                 );
                  }
                  peVar18 = ecs_table_get_data(peVar4);
                  peVar19 = peVar18->sw_columns + ((ulong)(uint)(iVar27 - iVar30) - 1);
                  *(ecs_sw_column_t **)((long)pvVar14 + lVar16) = peVar19;
                }
                iVar9 = ecs_switch_case_count
                                  (peVar19->data,*(uint64_t *)((long)pvVar14 + lVar16 + 8));
                if (iVar9 < iVar10) {
                  iVar10 = iVar9;
                  iVar7 = iVar33;
                }
                lVar16 = lVar16 + 0x18;
                iVar33 = iVar33 + 1;
              } while ((ulong)uVar8 * 0x18 != lVar16);
            }
            (it->iter).query.sparse_smallest = iVar7;
          }
          uVar35 = iVar7 - 1;
          pvVar14 = _ecs_vector_first(vector,0x18,0x10);
          sw = (ecs_switch_t *)**(undefined8 **)((long)pvVar14 + (long)(int)uVar35 * 0x18);
          if (iVar31 == 0) {
            uVar8 = ecs_switch_first(sw,*(uint64_t *)((long)pvVar14 + (long)(int)uVar35 * 0x18 + 8))
            ;
          }
          else {
            uVar8 = ecs_switch_next(sw,(it->iter).query.sparse_first);
          }
          if (uVar8 == 0xffffffff) {
LAB_0011aa24:
            *(ecs_match_kind_t *)((long)&it->iter + 0x10) = EcsMatchDefault;
            *(ecs_match_kind_t *)((long)&it->iter + 0x14) = EcsMatchDefault;
            goto LAB_0011aacd;
          }
          uVar25 = ecs_vector_count(vector);
          if ((int)uVar25 < 1) {
            if (uVar25 != 0) {
              do {
              } while( true );
            }
          }
          else {
            lVar16 = 0;
            do {
              if ((((ulong)uVar35 * 0x18 != lVar16) &&
                  (uVar20 = ecs_switch_get((ecs_switch_t *)**(undefined8 **)((long)pvVar14 + lVar16)
                                           ,uVar8),
                  uVar20 != *(uint64_t *)((long)pvVar14 + lVar16 + 8))) &&
                 (uVar8 = ecs_switch_next(sw,uVar8), uVar8 == 0xffffffff)) goto LAB_0011aa24;
              lVar16 = lVar16 + 0x18;
            } while ((ulong)uVar25 * 0x18 != lVar16);
          }
          (it->iter).query.sparse_first = uVar8;
          (it->iter).query.index = (int32_t)lVar22;
          iVar31 = 1;
        }
        iVar10 = (it->iter).query.page_iter.offset;
        iVar33 = (it->iter).query.page_iter.limit;
        iVar27 = iVar31;
        if (iVar10 == 0 && iVar33 == 0) {
LAB_0011aac8:
          if (iVar31 == 0) goto LAB_0011aacd;
        }
        else {
          iVar30 = (it->iter).query.page_iter.remaining;
          if (iVar10 != 0) {
            if (iVar10 - iVar31 != 0 && iVar31 <= iVar10) {
              (it->iter).query.page_iter.offset = iVar10 - iVar31;
              goto LAB_0011aacd;
            }
            uVar8 = uVar8 + iVar10;
            iVar31 = iVar31 - iVar10;
            (it->iter).query.page_iter.offset = 0;
          }
          if (iVar30 == 0) {
            iVar27 = iVar31;
            if (iVar33 != 0) {
              return false;
            }
            goto LAB_0011aac8;
          }
          iVar10 = iVar30 - iVar31;
          bVar37 = iVar10 != 0;
          iVar27 = iVar30;
          if (iVar31 <= iVar30) {
            iVar27 = iVar31;
          }
          if (!bVar37 || iVar30 < iVar31) {
            iVar10 = 0;
          }
          (it->iter).query.page_iter.remaining = iVar10;
          if (bVar37 && iVar31 <= iVar30) goto LAB_0011aac8;
        }
        pvVar11 = _ecs_vector_first(peVar13->entities,8,0x10);
        it->entities = (ecs_entity_t *)((long)pvVar11 + (long)(int)uVar8 * 8);
        it->offset = uVar8;
        it->count = iVar27;
        it->total_count = iVar27;
LAB_0011ab2c:
        it->table = peVar29;
        it->frame_offset = it->frame_offset + iVar2;
        if (peVar4 == (ecs_table_t *)0x0) {
          return true;
        }
        if ((peVar3->flags & 0x400) == 0) {
          return true;
        }
        peVar4 = peVar29->table;
        if (peVar4 == (ecs_table_t *)0x0) {
          return true;
        }
        if (peVar4->dirty_state == (int32_t *)0x0) {
          return true;
        }
        uVar8 = ecs_vector_count((peVar3->sig).columns);
        pvVar11 = _ecs_vector_first((peVar3->sig).columns,0x28,0x10);
        if ((int)uVar8 < 1) {
          return true;
        }
        piVar21 = (int *)((long)pvVar11 + 8);
        uVar23 = 0;
        do {
          if ((*piVar21 != 1) && (0 < (long)peVar29->columns[uVar23])) {
            peVar4->dirty_state[peVar29->columns[uVar23]] =
                 peVar4->dirty_state[peVar29->columns[uVar23]] + 1;
          }
          uVar23 = uVar23 + 1;
          piVar21 = piVar21 + 10;
        } while (uVar8 != uVar23);
        return true;
      }
LAB_0011aacd:
      lVar22 = lVar22 + 1;
    } while (iVar1 != iVar24);
  }
  return false;
}

Assistant:

bool ecs_query_next(
    ecs_iter_t *it)
{
    ecs_assert(it != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_query_iter_t *iter = &it->iter.query;
    ecs_page_iter_t *piter = &iter->page_iter;
    ecs_world_t *world = it->world;
    ecs_query_t *query = it->query;

    ecs_get_stage(&world);
    ecs_table_slice_t *slice = ecs_vector_first(
        query->table_slices, ecs_table_slice_t);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);

    ecs_assert(!slice || query->compare, ECS_INTERNAL_ERROR, NULL);
    
    ecs_page_cursor_t cur;
    int32_t table_count = it->table_count;
    int32_t prev_count = it->total_count;

    int i;
    for (i = iter->index; i < table_count; i ++) {
        ecs_matched_table_t *table_data = slice ? slice[i].table : &tables[i];
        ecs_table_t *table = table_data->iter_data.table;
        ecs_data_t *data = NULL;

        iter->index = i + 1;
        
        if (table) {
            ecs_vector_t *bitset_columns = table_data->bitset_columns;
            ecs_vector_t *sparse_columns = table_data->sparse_columns;
            data = ecs_table_get_data(table);
            ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);
            it->table_columns = data->columns;
            
            if (slice) {
                cur.first = slice[i].start_row;
                cur.count = slice[i].count;                
            } else {
                cur.first = 0;
                cur.count = ecs_table_count(table);
            }

            if (cur.count) {
                if (bitset_columns) {
            
                    if (bitset_column_next(table, bitset_columns, iter, 
                        &cur) == -1) 
                    {
                        /* No more enabled components for table */
                        continue; 
                    } else {
                        iter->index = i;
                    }
                }

                if (sparse_columns) {
                    if (sparse_column_next(table, table_data,
                        sparse_columns, iter, &cur) == -1)
                    {
                        /* No more elements in sparse column */
                        continue;    
                    } else {
                        iter->index = i;
                    }
                }

                int ret = ecs_page_iter_next(piter, &cur);
                if (ret < 0) {
                    return false;
                } else if (ret > 0) {
                    continue;
                }
            } else {
                continue;
            }

            ecs_entity_t *entity_buffer = ecs_vector_first(
                data->entities, ecs_entity_t); 
            it->entities = &entity_buffer[cur.first];
            it->offset = cur.first;
            it->count = cur.count;
            it->total_count = cur.count;
        }

        it->table = &table_data->iter_data;
        it->frame_offset += prev_count;

        if (query->flags & EcsQueryHasOutColumns) {
            if (table) {
                mark_columns_dirty(query, table_data);
            }
        }

        return true;
    }

    return false;
}